

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O3

void __thiscall
powerpc_test_cpu::test_instruction_CRR__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint32_t a1;
  uint32_t a2;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (test_instruction_CRR__(char_const*,unsigned_int)::code == '\0') {
    test_instruction_CRR__();
  }
  iVar1 = 0;
  do {
    test_instruction_CRR__::code[0] = iVar1 * 0x800000 + (opcode & 0xfc7fffff);
    test_instruction_CRR__::code[3] = test_instruction_CRR__::code[0] & 0xffe0ffff;
    lVar2 = 0;
    do {
      a1 = reg_values[lVar2];
      lVar3 = 0;
      do {
        a2 = *(uint32_t *)((long)reg_values + lVar3);
        test_one(this,test_instruction_CRR__::code,insn,a1,a2,0,0);
        test_one(this,test_instruction_CRR__::code + 2,insn,a1,a2,0,0);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x90);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x24);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 8);
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_CRR__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_values = sizeof(reg_values)/sizeof(reg_values[0]);

	for (int k = 0; k < 8; k++) {
		crfD_field::insert(opcode, k);
		code[0] = code[3] = opcode;			// <op> crfD,RA,RB
		rA_field::insert(code[3], 0);		// <op> crfD,R0,RB
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_values; i++) {
			const uint32_t ra = reg_values[i];
			for (int j = 0; j < n_values; j++) {
			const uint32_t rb = reg_values[j];
			test_one(&code[0], insn, ra, rb, 0);
			test_one(&code[2], insn, ra, rb, 0);
			}
		}
	}
}